

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O1

void google::protobuf::internal::AssignDescriptors
               (string *filename,MigrationSchema *schemas,Message **default_instances_,
               uint32 *offsets,MessageFactory *factory,Metadata *file_level_metadata,
               EnumDescriptor **file_level_enum_descriptors,
               ServiceDescriptor **file_level_service_descriptors)

{
  int iVar1;
  DescriptorPool *this;
  FileDescriptor *pFVar2;
  LogMessage *other;
  long lVar3;
  long lVar4;
  AssignDescriptorsHelper<google::protobuf::internal::MigrationSchema> local_98;
  LogMessage local_68;
  
  this = DescriptorPool::generated_pool();
  pFVar2 = DescriptorPool::FindFileByName(this,filename);
  if (pFVar2 == (FileDescriptor *)0x0) {
    LogMessage::LogMessage
              (&local_68,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/generated_message_reflection.cc"
               ,0x908);
    other = LogMessage::operator<<(&local_68,"CHECK failed: file != NULL: ");
    LogFinisher::operator=((LogFinisher *)&local_98,other);
    LogMessage::~LogMessage(&local_68);
  }
  if (factory == (MessageFactory *)0x0) {
    factory = MessageFactory::generated_factory();
  }
  local_98.file_level_enum_descriptors_ = file_level_enum_descriptors;
  if (0 < *(int *)(pFVar2 + 0x58)) {
    lVar4 = 0;
    lVar3 = 0;
    local_98.factory_ = factory;
    local_98.file_level_metadata_ = file_level_metadata;
    local_98.schemas_ = schemas;
    local_98.default_instance_data_ = default_instances_;
    local_98.offsets_ = offsets;
    do {
      anon_unknown_0::AssignDescriptorsHelper<google::protobuf::internal::MigrationSchema>::
      AssignMessageDescriptor(&local_98,(Descriptor *)(*(long *)(pFVar2 + 0x60) + lVar4));
      lVar3 = lVar3 + 1;
      lVar4 = lVar4 + 0xa8;
    } while (lVar3 < *(int *)(pFVar2 + 0x58));
  }
  iVar1 = *(int *)(pFVar2 + 0x68);
  if (0 < (long)iVar1) {
    lVar3 = 0;
    do {
      *local_98.file_level_enum_descriptors_ = (EnumDescriptor *)(*(long *)(pFVar2 + 0x70) + lVar3);
      local_98.file_level_enum_descriptors_ = local_98.file_level_enum_descriptors_ + 1;
      lVar3 = lVar3 + 0x38;
    } while ((long)iVar1 * 0x38 - lVar3 != 0);
  }
  if ((*(char *)(*(long *)(pFVar2 + 0xa0) + 0xa3) == '\x01') &&
     (iVar1 = *(int *)(pFVar2 + 0x78), 0 < (long)iVar1)) {
    lVar3 = 0;
    do {
      *file_level_service_descriptors = (ServiceDescriptor *)(*(long *)(pFVar2 + 0x80) + lVar3);
      file_level_service_descriptors = file_level_service_descriptors + 1;
      lVar3 = lVar3 + 0x30;
    } while ((long)iVar1 * 0x30 != lVar3);
  }
  return;
}

Assistant:

void AssignDescriptors(
    const string& filename, const MigrationSchema* schemas,
    const Message* const* default_instances_, const uint32* offsets,
    MessageFactory* factory,
    // update the following descriptor arrays.
    Metadata* file_level_metadata,
    const EnumDescriptor** file_level_enum_descriptors,
    const ServiceDescriptor** file_level_service_descriptors) {
  const ::google::protobuf::FileDescriptor* file =
      ::google::protobuf::DescriptorPool::generated_pool()->FindFileByName(filename);
  GOOGLE_CHECK(file != NULL);

  if (!factory) factory = MessageFactory::generated_factory();

  AssignDescriptorsHelper<MigrationSchema> helper(factory, file_level_metadata,
                                 file_level_enum_descriptors, schemas,
                                 default_instances_, offsets);

  for (int i = 0; i < file->message_type_count(); i++) {
    helper.AssignMessageDescriptor(file->message_type(i));
  }

  for (int i = 0; i < file->enum_type_count(); i++) {
    helper.AssignEnumDescriptor(file->enum_type(i));
  }
  if (file->options().cc_generic_services()) {
    for (int i = 0; i < file->service_count(); i++) {
      file_level_service_descriptors[i] = file->service(i);
    }
  }
}